

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_randomnumberutil.cpp
# Opt level: O3

void __thiscall
RandomNumberUtil_GetRandomBool_Test::TestBody(RandomNumberUtil_GetRandomBool_Test *this)

{
  bool bVar1;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  AssertHelper local_38;
  void *local_30;
  undefined4 local_28;
  undefined8 local_20;
  undefined4 local_18;
  undefined8 local_10;
  
  local_30 = (void *)0x0;
  local_28 = 0;
  local_20 = 0;
  local_18 = 0;
  local_10 = 0;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::RandomNumberUtil::GetRandomBool((vector<bool,_std::allocator<bool>_> *)&local_30);
    }
  }
  else {
    testing::Message::Message((Message *)&local_40);
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_randomnumberutil.cpp"
               ,0x59,
               "Expected: RandomNumberUtil::GetRandomBool(&cashe) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_40.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_40.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_40.ptr_ + 8))();
      }
    }
  }
  if (local_30 != (void *)0x0) {
    operator_delete(local_30);
  }
  return;
}

Assistant:

TEST(RandomNumberUtil, GetRandomBool) {
  std::vector<bool> cashe;
  EXPECT_NO_THROW(RandomNumberUtil::GetRandomBool(&cashe));
}